

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O1

void __thiscall
QTransposeProxyModel::setSourceModel(QTransposeProxyModel *this,QAbstractItemModel *newSourceModel)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  Data *pDVar1;
  Connection *pCVar2;
  parameter_type pQVar3;
  QObject *pQVar4;
  QSlotObjectBase *pQVar5;
  Connection *pCVar6;
  long lVar7;
  long lVar8;
  Connection *discIter;
  ulong uVar9;
  Connection *data;
  long in_FS_OFFSET;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  QArrayDataPointer<QMetaObject::Connection> local_100;
  QArrayData *d;
  Connection *pCStack_e0;
  qsizetype local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar7 + 0xd8);
  pQVar3 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(this_00);
  if (pQVar3 != newSourceModel) {
    QAbstractItemModel::beginResetModel((QAbstractItemModel *)this);
    pQVar3 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             ::value(this_00);
    if ((pQVar3 != (parameter_type)0x0) && (*(long *)(lVar7 + 0xf8) != 0)) {
      pCVar6 = *(Connection **)(lVar7 + 0xf0);
      lVar8 = *(long *)(lVar7 + 0xf8) << 3;
      do {
        QObject::disconnect(pCVar6);
        pCVar6 = pCVar6 + 1;
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    QList<QMetaObject::Connection>::clear((QList<QMetaObject::Connection> *)(lVar7 + 0xe8));
    QAbstractProxyModel::setSourceModel((QAbstractProxyModel *)this,newSourceModel);
    pQVar3 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             ::value(this_00);
    if (pQVar3 != (parameter_type)0x0) {
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_110 = QAbstractItemModel::beginResetModel;
      local_108 = 0;
      d = (QArrayData *)QAbstractItemModel::modelAboutToBeReset;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::beginResetModel;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_c8,pQVar4,&d,(QObject *)this,&local_110,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_120 = QAbstractItemModel::endResetModel;
      local_118 = 0;
      d = (QArrayData *)QAbstractItemModel::modelReset;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endResetModel;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_c8 + 8),pQVar4,&d,(QObject *)this,&local_120,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::dataChanged;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&)>,_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onDataChanged;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_b8,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::headerDataChanged;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(Qt::Orientation,_int,_int)>,_QtPrivate::List<Qt::Orientation,_int,_int>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onHeaderDataChanged;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)(local_b8 + 8),pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::columnsAboutToBeInserted;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onColumnsAboutToBeInserted;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_a8,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::columnsAboutToBeMoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onColumnsAboutToBeMoved;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)(local_a8 + 8),pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::columnsAboutToBeRemoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onColumnsAboutToBeRemoved;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_98,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_130 = QAbstractItemModel::endInsertRows;
      local_128 = 0;
      d = (QArrayData *)QAbstractItemModel::columnsInserted;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endInsertRows;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_98 + 8),pQVar4,&d,(QObject *)this,&local_130,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_140 = QAbstractItemModel::endRemoveRows;
      local_138 = 0;
      d = (QArrayData *)QAbstractItemModel::columnsRemoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endRemoveRows;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_88,pQVar4,&d,(QObject *)this,&local_140,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_150 = QAbstractItemModel::endMoveRows;
      local_148 = 0;
      d = (QArrayData *)QAbstractItemModel::columnsMoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endMoveRows;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_88 + 8),pQVar4,&d,(QObject *)this,&local_150,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::rowsAboutToBeInserted;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onRowsAboutToBeInserted;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_78,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::rowsAboutToBeMoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onRowsAboutToBeMoved;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)(local_78 + 8),pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::rowsAboutToBeRemoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>,_QtPrivate::List<const_QModelIndex_&,_int,_int,_QAbstractItemModel::QPrivateSignal>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onRowsAboutToBeRemoved;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_68,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_160 = QAbstractItemModel::endInsertColumns;
      local_158 = 0;
      d = (QArrayData *)QAbstractItemModel::rowsInserted;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endInsertColumns;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_68 + 8),pQVar4,&d,(QObject *)this,&local_160,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_170 = QAbstractItemModel::endRemoveColumns;
      local_168 = 0;
      d = (QArrayData *)QAbstractItemModel::rowsRemoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endRemoveColumns;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_58,pQVar4,&d,(QObject *)this,&local_170,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      local_180 = QAbstractItemModel::endMoveColumns;
      local_178 = 0;
      d = (QArrayData *)QAbstractItemModel::rowsMoved;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::QCallableObject<void_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar5 + 1) = QAbstractItemModel::endMoveColumns;
      pQVar5[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_58 + 8),pQVar4,&d,(QObject *)this,&local_180,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::layoutAboutToBeChanged;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onLayoutAboutToBeChanged;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)local_48,pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,AutoConnection,
                 (int *)0x0,&QAbstractItemModel::staticMetaObject);
      pQVar4 = &QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::value(this_00)->super_QObject;
      d = (QArrayData *)QAbstractItemModel::layoutChanged;
      pCStack_e0 = (Connection *)0x0;
      pQVar5 = (QSlotObjectBase *)operator_new(0x28);
      (pQVar5->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar5->m_impl =
           QtPrivate::
           QCallableObject<std::_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(code **)(pQVar5 + 1) = QTransposeProxyModelPrivate::onLayoutChanged;
      pQVar5[1].m_impl = (ImplFn)0x0;
      *(long *)(pQVar5 + 2) = lVar7;
      QObject::connectImpl
                ((QObject *)(local_48 + 8),pQVar4,&d,(QObject *)this,(void **)0x0,pQVar5,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      d = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pCVar6 = (Connection *)QArrayData::allocate(&d,8,0x10,0x12,KeepSize);
      local_100.d = (Data *)d;
      local_100.size = 0;
      uVar9 = 0xfffffffffffffff8;
      local_100.ptr = pCVar6;
      do {
        QMetaObject::Connection::Connection
                  (pCVar6 + local_100.size,(Connection *)(local_c8 + uVar9 + 8));
        pCVar2 = local_100.ptr;
        pDVar1 = local_100.d;
        lVar8 = local_100.size + 1;
        uVar9 = uVar9 + 8;
        local_100.size = lVar8;
      } while (uVar9 < 0x88);
      local_100.d = (Data *)0x0;
      local_100.ptr = (Connection *)0x0;
      local_100.size = 0;
      d = *(QArrayData **)(lVar7 + 0xe8);
      pCStack_e0 = *(Connection **)(lVar7 + 0xf0);
      *(Data **)(lVar7 + 0xe8) = pDVar1;
      *(Connection **)(lVar7 + 0xf0) = pCVar2;
      local_d8 = *(qsizetype *)(lVar7 + 0xf8);
      *(long *)(lVar7 + 0xf8) = lVar8;
      QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer
                ((QArrayDataPointer<QMetaObject::Connection> *)&d);
      QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer(&local_100);
      lVar7 = 0x88;
      do {
        QMetaObject::Connection::~Connection((Connection *)(local_c8 + lVar7));
        lVar7 = lVar7 + -8;
      } while (lVar7 != -8);
    }
    QAbstractItemModel::endResetModel((QAbstractItemModel *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModel::setSourceModel(QAbstractItemModel* newSourceModel)
{
    Q_D(QTransposeProxyModel);
    if (newSourceModel == d->model)
        return;
    beginResetModel();
    if (d->model) {
        for (const QMetaObject::Connection& discIter : std::as_const(d->sourceConnections))
            disconnect(discIter);
    }
    d->sourceConnections.clear();
    QAbstractProxyModel::setSourceModel(newSourceModel);
    if (d->model) {
        using namespace std::placeholders;
        d->sourceConnections = QList<QMetaObject::Connection>{
            connect(d->model, &QAbstractItemModel::modelAboutToBeReset, this, &QTransposeProxyModel::beginResetModel),
            connect(d->model, &QAbstractItemModel::modelReset, this, &QTransposeProxyModel::endResetModel),
            connect(d->model, &QAbstractItemModel::dataChanged, this, std::bind(&QTransposeProxyModelPrivate::onDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::headerDataChanged, this, std::bind(&QTransposeProxyModelPrivate::onHeaderDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsInserted, this, &QTransposeProxyModel::endInsertRows),
            connect(d->model, &QAbstractItemModel::columnsRemoved, this, &QTransposeProxyModel::endRemoveRows),
            connect(d->model, &QAbstractItemModel::columnsMoved, this, &QTransposeProxyModel::endMoveRows),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsInserted, this, &QTransposeProxyModel::endInsertColumns),
            connect(d->model, &QAbstractItemModel::rowsRemoved, this, &QTransposeProxyModel::endRemoveColumns),
            connect(d->model, &QAbstractItemModel::rowsMoved, this, &QTransposeProxyModel::endMoveColumns),
            connect(d->model, &QAbstractItemModel::layoutAboutToBeChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutAboutToBeChanged, d, _1, _2)),
            connect(d->model, &QAbstractItemModel::layoutChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutChanged, d, _1, _2))
        };
    }
    endResetModel();
}